

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_make_primitive_env_op(sexp ctx,sexp self,sexp_sint_t n,sexp version)

{
  uchar *puVar1;
  sexp psVar2;
  long lVar3;
  sexp_opcode_struct *psVar4;
  anon_union_24768_35_b8e82fc1_for_value *paVar5;
  long lVar6;
  byte bVar7;
  sexp op;
  sexp name;
  sexp e;
  sexp sym;
  sexp local_80;
  sexp local_78;
  undefined1 local_70 [16];
  undefined1 local_60 [32];
  undefined1 local_40 [32];
  
  bVar7 = 0;
  local_60._0_8_ = local_70;
  local_70._0_8_ = 5.36555291383594e-321;
  local_40._16_8_ = &local_80;
  local_80 = (sexp)&DAT_0000043e;
  local_40._0_8_ = local_70 + 8;
  local_70._8_8_ = &DAT_0000043e;
  local_60._16_8_ = &local_78;
  local_78 = (sexp)&DAT_0000043e;
  local_40._24_8_ = local_60;
  local_60._8_8_ = (ctx->value).context.saves;
  local_40._8_8_ = local_40 + 0x10;
  local_60._24_8_ = local_40;
  (ctx->value).context.saves = (sexp_gc_var_t *)(local_60 + 0x10);
  local_70._0_8_ =
       sexp_make_null_env_op(ctx,(sexp)local_60._16_8_,local_40._0_8_,(sexp)(local_60 + 0x10));
  if (sexp_primitive_opcodes->op_class != '\0') {
    lVar6 = 0x68;
    psVar4 = sexp_primitive_opcodes;
    do {
      local_80 = sexp_alloc_tagged_aux(ctx,0x70,0x1b);
      paVar5 = &local_80->value;
      for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
        (paVar5->vector).length = (sexp_uint_t)psVar4->name;
        psVar4 = (sexp_opcode_struct *)((long)psVar4 + (ulong)bVar7 * -0x10 + 8);
        paVar5 = (anon_union_24768_35_b8e82fc1_for_value *)((long)paVar5 + (ulong)bVar7 * -0x10 + 8)
        ;
      }
      local_78 = sexp_intern(ctx,(char *)(local_80->value).type.name,-1);
      psVar2 = sexp_c_string(ctx,(char *)(local_80->value).type.name,-1);
      (local_80->value).type.name = psVar2;
      if ((((local_80->value).opcode.flags & 2) == 0) ||
         (psVar2 = (local_80->value).type.cpl, psVar2 == (sexp)0x0)) {
        if ((local_80->value).flonum_bits[0x58] == '\n') {
          psVar2 = sexp_cons_op(ctx,(sexp)0x0,2,local_78,(sexp)&DAT_0000003e);
          goto LAB_00126e75;
        }
      }
      else {
        local_70._8_8_ = sexp_intern(ctx,(char *)psVar2,-1);
        psVar2 = sexp_env_cell_loc(ctx,(sexp)local_70._0_8_,(sexp)local_70._8_8_,0,
                                   (sexp_conflict *)0x0);
        if (psVar2 == (sexp)0x0) {
          psVar2 = (sexp)&DAT_0000003e;
        }
        else {
          psVar2 = (psVar2->value).type.cpl;
        }
LAB_00126e75:
        (local_80->value).type.cpl = psVar2;
      }
      if (((local_80->value).flonum_bits[0x58] == '\v') &&
         (psVar2 = (local_80->value).type.slots, psVar2 != (sexp)0x0)) {
        psVar2 = sexp_c_string(ctx,(char *)psVar2,-1);
        (local_80->value).type.slots = psVar2;
      }
      sexp_env_define(ctx,(sexp)local_70._0_8_,local_78,local_80);
      psVar4 = (sexp_opcode_struct *)((long)&sexp_primitive_opcodes->name + lVar6);
      puVar1 = &sexp_primitive_opcodes->op_class + lVar6;
      lVar6 = lVar6 + 0x68;
    } while (*puVar1 != '\0');
  }
  (ctx->value).context.saves = (sexp_gc_var_t *)local_60._8_8_;
  return (sexp)local_70._0_8_;
}

Assistant:

sexp sexp_make_primitive_env_op (sexp ctx, sexp self, sexp_sint_t n, sexp version) {
  int i;
  sexp_gc_var4(e, op, sym, name);
  sexp_gc_preserve4(ctx, e, op, sym, name);
  e = sexp_make_null_env(ctx, version);
  for (i=0; sexp_primitive_opcodes[i].op_class; i++) {
    op = sexp_copy_opcode(ctx, &sexp_primitive_opcodes[i]);
    name = sexp_intern(ctx, (char*)sexp_opcode_name(op), -1);
    sexp_opcode_name(op) = sexp_c_string(ctx, (char*)sexp_opcode_name(op), -1);
    if (sexp_opcode_opt_param_p(op) && sexp_opcode_data(op)) {
      sym = sexp_intern(ctx, (char*)sexp_opcode_data(op), -1);
      sexp_opcode_data(op) = sexp_env_ref(ctx, e, sym, SEXP_FALSE);
    } else if (sexp_opcode_class(op) == SEXP_OPC_PARAMETER) {
      sexp_opcode_data(op) = sexp_cons(ctx, name, SEXP_FALSE);
    }
    if (sexp_opcode_class(op) == SEXP_OPC_FOREIGN && sexp_opcode_data2(op)) {
      sexp_opcode_data2(op) = sexp_c_string(ctx, (char*)sexp_opcode_data2(op), -1);
    }
    sexp_env_define(ctx, e, name, op);
  }
  sexp_gc_release4(ctx);
  return e;
}